

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
::int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::num_writer::operator()
          (num_writer *this,truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *it)

{
  int iVar1;
  ulong uVar2;
  value_type vVar3;
  ulong uVar4;
  long lVar5;
  byte bVar6;
  ulong uVar7;
  ulong uVar8;
  value_type *pvVar9;
  int iVar10;
  value_type *pvVar11;
  size_t sVar12;
  value_type vVar13;
  long lVar14;
  value_type local_59 [41];
  char_type buffer [26];
  
  pvVar11 = (it->super_truncating_iterator_base<char_*>).out_;
  uVar2 = (it->super_truncating_iterator_base<char_*>).limit_;
  sVar12 = (it->super_truncating_iterator_base<char_*>).count_;
  local_59[0] = it->blackhole_;
  uVar8 = *(ulong *)this;
  iVar1 = *(int *)(this + 8);
  lVar14 = (long)iVar1;
  pvVar9 = local_59 + lVar14 + 1;
  if (uVar8 < 100) {
    if (9 < uVar8) {
      uVar8 = (ulong)(uint)((int)uVar8 * 2);
      local_59[lVar14] = internal::basic_data<void>::DIGITS[uVar8 + 1];
      pvVar9 = local_59 + lVar14;
      goto LAB_00160bfa;
    }
  }
  else {
    iVar10 = 0;
    do {
      uVar7 = uVar8;
      uVar8 = uVar7 / 100;
      uVar4 = (ulong)(uint)(((int)uVar7 + (int)uVar8 * -100) * 2);
      pvVar9[-1] = internal::basic_data<void>::DIGITS[uVar4 + 1];
      if (iVar10 * -0x55555555 + 0xaaaaaaabU < 0x55555556) {
        *(num_writer *)(pvVar9 + -2) = this[0xc];
        pvVar9[-3] = internal::basic_data<void>::DIGITS[uVar4];
        if ((uint)((iVar10 + 2) * -0x55555555) < 0x55555556) {
          lVar5 = -4;
          goto LAB_00160b81;
        }
        pvVar9 = pvVar9 + -3;
      }
      else {
        pvVar9[-2] = internal::basic_data<void>::DIGITS[uVar4];
        if ((uint)((iVar10 + 2) * -0x55555555) < 0x55555556) {
          lVar5 = -3;
LAB_00160b81:
          *(num_writer *)(pvVar9 + lVar5) = this[0xc];
          pvVar9 = pvVar9 + lVar5;
        }
        else {
          pvVar9 = pvVar9 + -2;
        }
      }
      iVar10 = iVar10 + 2;
    } while (9999 < uVar7);
    if (999 < uVar7) {
      uVar8 = (ulong)(uint)((int)uVar8 * 2);
      pvVar9[-1] = internal::basic_data<void>::DIGITS[uVar8 + 1];
      if (iVar10 * -0x55555555 + 0xaaaaaaabU < 0x55555556) {
        *(num_writer *)(pvVar9 + -2) = this[0xc];
        pvVar9 = pvVar9 + -2;
      }
      else {
        pvVar9 = pvVar9 + -1;
      }
LAB_00160bfa:
      bVar6 = internal::basic_data<void>::DIGITS[uVar8];
      vVar13 = local_59[0];
      goto LAB_00160c06;
    }
  }
  bVar6 = (byte)uVar8 | 0x30;
  vVar13 = local_59[0];
LAB_00160c06:
  pvVar9[-1] = bVar6;
  if (0 < iVar1) {
    lVar5 = 0;
    do {
      vVar3 = local_59[lVar5 + 1];
      if (sVar12 + lVar5 < uVar2) {
        *pvVar11 = local_59[lVar5 + 1];
        pvVar11 = pvVar11 + 1;
        vVar3 = vVar13;
      }
      vVar13 = vVar3;
      lVar5 = lVar5 + 1;
    } while (lVar14 != lVar5);
    sVar12 = sVar12 + lVar14;
  }
  (it->super_truncating_iterator_base<char_*>).out_ = pvVar11;
  (it->super_truncating_iterator_base<char_*>).limit_ = uVar2;
  (it->super_truncating_iterator_base<char_*>).count_ = sVar12;
  it->blackhole_ = vVar13;
  return;
}

Assistant:

void operator()(It &&it) const {
        basic_string_view<char_type> s(&sep, SEP_SIZE);
        it = internal::format_decimal<char_type>(
              it, abs_value, size, internal::add_thousands_sep<char_type>(s));
      }